

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

char * fs_stdio_get_current_directory(void)

{
  char *pcVar1;
  char *cwd;
  char tmpdir [4096];
  char *in_stack_ffffffffffffefe8;
  undefined8 in_stack_ffffffffffffeff0;
  int line;
  size_t in_stack_ffffffffffffeff8;
  char *local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffeff0 >> 0x20);
  pcVar1 = getcwd(&stack0xffffffffffffeff8,0x1000);
  if (pcVar1 == (char *)0x0) {
    __errno_location();
    al_set_errno(line);
    local_8 = (char *)0x0;
  }
  else {
    strlen(&stack0xffffffffffffeff8);
    pcVar1 = (char *)al_malloc_with_context
                               (in_stack_ffffffffffffeff8,line,in_stack_ffffffffffffefe8,
                                (char *)0x177dff);
    if (pcVar1 == (char *)0x0) {
      al_set_errno(0);
      local_8 = (char *)0x0;
    }
    else {
      local_8 = strcpy(pcVar1,&stack0xffffffffffffeff8);
    }
  }
  return local_8;
}

Assistant:

static char *fs_stdio_get_current_directory(void)
{
#ifdef ALLEGRO_WINDOWS
   wchar_t *wcwd;
   char *cwd;
   
   wcwd = _wgetcwd(NULL, 1);
   if (!wcwd) {
      al_set_errno(errno);
      return NULL;
   }
   cwd = _al_win_utf16_to_utf8(wcwd);
   free(wcwd);
   return cwd;
#else
   char tmpdir[PATH_MAX];
   char *cwd;

   if (!getcwd(tmpdir, PATH_MAX)) {
      al_set_errno(errno);
      return NULL;
   }

   cwd = al_malloc(strlen(tmpdir) + 1);
   if (!cwd) {
      al_set_errno(ENOMEM);
      return NULL;
   }
   return strcpy(cwd, tmpdir);
#endif
}